

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::ResultBuilder::captureExpectedException(ResultBuilder *this,string *expectedMessage)

{
  ulong uVar1;
  string *in_RDI;
  Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_000000a8;
  ResultBuilder *in_stack_000000b0;
  Equals *in_stack_ffffffffffffff70;
  AllOf<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *this_00;
  AllOf<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_38;
  
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    Matchers::Equals(in_RDI,(Choice)((ulong)in_stack_ffffffffffffff70 >> 0x20));
    captureExpectedException(in_stack_000000b0,in_stack_000000a8);
    Matchers::Impl::StdString::Equals::~Equals(in_stack_ffffffffffffff70);
  }
  else {
    this_00 = &local_38;
    Matchers::Impl::Generic::
    AllOf<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::AllOf
              (this_00);
    captureExpectedException(in_stack_000000b0,in_stack_000000a8);
    Matchers::Impl::Generic::
    AllOf<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~AllOf
              (this_00);
  }
  return;
}

Assistant:

void ResultBuilder::captureExpectedException( std::string const& expectedMessage ) {
        if( expectedMessage.empty() )
            captureExpectedException( Matchers::Impl::Generic::AllOf<std::string>() );
        else
            captureExpectedException( Matchers::Equals( expectedMessage ) );
    }